

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

void __thiscall rtosc::Ports::dispatch(Ports *this,char *m,RtData *d,bool base_dispatch)

{
  char cVar1;
  int i;
  void *pvVar2;
  Port_Matcher *pPVar3;
  int *piVar4;
  Port *pPVar5;
  pointer piVar6;
  pointer pPVar7;
  pointer pbVar8;
  bool bVar9;
  _Bool _Var10;
  iterator __begin3;
  int *piVar11;
  char *pcVar12;
  undefined7 in_register_00000009;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  vector<rtosc::Port,_std::allocator<rtosc::Port>_> *__range2;
  Port *port;
  char *pcVar18;
  Port *pPVar19;
  char *m_end;
  
  pvVar2 = d->obj;
  if ((int)CONCAT71(in_register_00000009,base_dispatch) != 0) {
    d->matches = 0;
    d->message = m;
    if (m == (char *)0x0) {
      m = (char *)0x0;
    }
    else {
      m = m + (*m == '/');
    }
    if (d->loc != (char *)0x0) {
      *d->loc = '\0';
    }
  }
  pcVar18 = d->loc;
  if ((pcVar18 == (char *)0x0) || (d->loc_size == 0)) {
    pPVar5 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pPVar19 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                   _M_impl.super__Vector_impl_data._M_start; pPVar19 != pPVar5;
        pPVar19 = pPVar19 + 1) {
      _Var10 = rtosc_match(pPVar19->name,m,(char **)0x0);
      if (_Var10) {
        d->port = pPVar19;
        std::function<void_(const_char_*,_rtosc::RtData_&)>::operator()(&pPVar19->cb,m,d);
        d->obj = pvVar2;
      }
    }
  }
  else {
    if (*pcVar18 == '\0') {
      memset(pcVar18,0,d->loc_size);
      *d->loc = '/';
      pcVar18 = d->loc;
    }
    pcVar18 = pcVar18 + -1;
    do {
      pcVar12 = pcVar18 + 1;
      pcVar18 = pcVar18 + 1;
    } while (*pcVar12 != '\0');
    pPVar3 = this->impl;
    piVar11 = (pPVar3->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar4 = (pPVar3->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar11 == piVar4) {
      for (uVar16 = 0; uVar16 < this->elms; uVar16 = uVar16 + 1) {
        pPVar7 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl
                 .super__Vector_impl_data._M_start;
        _Var10 = rtosc_match(pPVar7[uVar16].name,m,&m_end);
        if (_Var10) {
          pPVar19 = pPVar7 + uVar16;
          if (pPVar19->ports == (Ports *)0x0) {
            d->matches = d->matches + 1;
          }
          pcVar12 = pPVar19->name;
          pcVar17 = strchr(pcVar12,0x23);
          if (pcVar17 == (char *)0x0) {
            scat(d->loc,pcVar12);
          }
          else {
            for (lVar14 = 0; (m[lVar14] != '\0' && (m + lVar14 != m_end)); lVar14 = lVar14 + 1) {
              pcVar18[lVar14] = m[lVar14];
            }
            pcVar18[lVar14] = '\0';
          }
          d->port = pPVar19;
          std::function<void_(const_char_*,_rtosc::RtData_&)>::operator()(&pPVar19->cb,m,d);
          d->obj = pvVar2;
          for (pcVar12 = pcVar18; *pcVar12 != '\0'; pcVar12 = pcVar12 + 1) {
            *pcVar12 = '\0';
          }
        }
      }
    }
    else {
      for (lVar14 = 0; (cVar1 = m[lVar14], cVar1 != '\0' && (cVar1 != '/')); lVar14 = lVar14 + 1) {
      }
      uVar15 = (ulong)(cVar1 == '/') + lVar14;
      uVar16 = uVar15 & 0xffffffff;
      for (; iVar13 = (int)uVar16, piVar11 != piVar4; piVar11 = piVar11 + 1) {
        if (*piVar11 < (int)uVar15) {
          uVar16 = (ulong)(uint)(iVar13 + (pPVar3->assoc).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[m[*piVar11]]);
        }
      }
      piVar6 = (pPVar3->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (iVar13 < (int)((ulong)((long)(pPVar3->remap).super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)piVar6) >>
                        2)) {
        i = piVar6[iVar13];
        bVar9 = Port_Matcher::hard_match(pPVar3,i,m);
        if (bVar9) {
          pPVar7 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pPVar3 = this->impl;
          iVar13 = (pPVar3->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar13];
          if (pPVar7[iVar13].ports == (Ports *)0x0) {
            d->matches = d->matches + 1;
          }
          pPVar19 = pPVar7 + iVar13;
          pcVar12 = m;
          pcVar17 = pcVar18;
          if (pPVar3->m_enump[i] == true) {
            for (; (cVar1 = *pcVar12, cVar1 != '\0' && (cVar1 != '/')); pcVar12 = pcVar12 + 1) {
              *pcVar17 = cVar1;
              pcVar17 = pcVar17 + 1;
            }
            pcVar12 = strchr(pPVar19->name,0x2f);
            if (pcVar12 != (char *)0x0) {
              *pcVar17 = '/';
              pcVar17 = pcVar17 + 1;
            }
            *pcVar17 = '\0';
          }
          else {
            pbVar8 = (pPVar3->fixed).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            memcpy(pcVar18,pbVar8[i]._M_dataplus._M_p,pbVar8[i]._M_string_length + 1);
          }
          d->port = pPVar19;
          std::function<void_(const_char_*,_rtosc::RtData_&)>::operator()(&pPVar19->cb,m,d);
          d->obj = pvVar2;
          *pcVar18 = '\0';
          return;
        }
      }
      if ((this->default_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
        d->matches = d->matches + 1;
        std::function<void_(const_char_*,_rtosc::RtData_&)>::operator()(&this->default_handler,m,d);
        d->obj = pvVar2;
      }
    }
  }
  return;
}

Assistant:

void Ports::dispatch(const char *m, rtosc::RtData &d, bool base_dispatch) const
{
    // rRecur*Cb have already set d.loc to the required pointer
    // in case no port will match, d.loc will not be touched
    // this enables returning the address of a runtime object

    void *obj = d.obj;

    //handle the first dispatch layer
    if(base_dispatch) {
        d.matches = 0;
        d.message = m;
        if(m && *m == '/')
            m++;
        if(d.loc)
            d.loc[0] = 0;
    }

    //simple case
    if(!d.loc || !d.loc_size) {
        for(const Port &port: ports) {
            if(rtosc_match(port.name,m, NULL))
                d.port = &port, port.cb(m,d), d.obj = obj;
        }
    } else {

        //TODO this function is certainly buggy at the moment, some tests
        //are needed to make it clean
        //XXX buffer_size is not properly handled yet
        if(__builtin_expect(d.loc[0] == 0, 0)) {
            memset(d.loc, 0, d.loc_size);
            d.loc[0] = '/';
        }

        char *old_end = d.loc;
        while(*old_end) ++old_end;

        if(impl->pos.empty()) { //No perfect minimal hash function
            for(unsigned i=0; i<elms; ++i) {
                const Port &port = ports[i];
                const char* m_end;
                if(!rtosc_match(port.name, m, &m_end))
                    continue;
                if(!port.ports)
                    d.matches++;

                //Append the path
                if(strchr(port.name,'#')) {
                    const char *msg = m;
                    char       *pos = old_end;
                    while(*msg && msg != m_end)
                        *pos++ = *msg++;
                    *pos = '\0';
                } else
                    scat(d.loc, port.name);

                d.port = &port;

                //Apply callback
                port.cb(m,d), d.obj = obj;

                //Remove the rest of the path
                char *tmp = old_end;
                while(*tmp) *tmp++=0;
            }
        } else {

            //Define string to be hashed
            unsigned len=0;
            const char *tmp = m;

            while(*tmp && *tmp != '/')
                tmp++;
            if(*tmp == '/')
                tmp++;
            len = tmp-m;

            //Compute the hash
            int t = len;
            for(auto p:impl->pos)
                if(p < (int)len)
                    t += impl->assoc[m[p]];
            if(t >= (int)impl->remap.size() && !default_handler)
                return;
            else if(t >= (int)impl->remap.size() && default_handler) {
                d.matches++;
                default_handler(m,d), d.obj = obj;
                return;
            }

            int port_num = impl->remap[t];

            //Verify the chosen port is correct
            if(__builtin_expect(impl->hard_match(port_num, m), 1)) {
                const Port &port = ports[impl->remap[t]];
                if(!port.ports)
                    d.matches++;

                //Append the path
                if(impl->enump()[port_num]) {
                    const char *msg = m;
                    char       *pos = old_end;
                    while(*msg && *msg != '/')
                        *pos++ = *msg++;
                    if(strchr(port.name, '/'))
                        *pos++ = '/';
                    *pos = '\0';
                } else
                    memcpy(old_end, impl->fixed[port_num].c_str(),
                            impl->fixed[port_num].length()+1);

                d.port = &port;

                //Apply callback
                port.cb(m,d), d.obj = obj;

                //Remove the rest of the path
                old_end[0] = '\0';
            } else if(default_handler) {
                d.matches++;
                default_handler(m,d), d.obj = obj;
            }
        }
    }
}